

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

TypeCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type&,soul::pool_ref<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,Type *args_1,pool_ref<soul::AST::Expression> *args_2)

{
  PoolItem *pPVar1;
  Type local_40;
  
  pPVar1 = allocateSpaceForObject(this,0x50);
  local_40.category = args_1->category;
  local_40.arrayElementCategory = args_1->arrayElementCategory;
  local_40.isRef = args_1->isRef;
  local_40.isConstant = args_1->isConstant;
  local_40.primitiveType.type = (args_1->primitiveType).type;
  local_40.boundingSize = args_1->boundingSize;
  local_40.arrayElementBoundingSize = args_1->arrayElementBoundingSize;
  local_40.structure.object = (args_1->structure).object;
  if (local_40.structure.object != (Structure *)0x0) {
    ((local_40.structure.object)->super_RefCountedObject).refCount =
         ((local_40.structure.object)->super_RefCountedObject).refCount + 1;
  }
  AST::TypeCast::TypeCast((TypeCast *)&pPVar1->item,args,&local_40,args_2->object);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
  pPVar1->destructor =
       allocate<soul::AST::TypeCast,_soul::AST::Context_&,_soul::Type_&,_soul::pool_ref<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (TypeCast *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }